

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate2<std::complex<float>_>::apply
          (QGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  long lVar1;
  _ComplexT _Var2;
  uint uVar3;
  long lVar4;
  complex<float> *pcVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined7 in_register_00000031;
  long lVar12;
  long lVar13;
  char *__assertion;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar28;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  float extraout_XMM0_Dc_06;
  float extraout_XMM0_Dc_07;
  float extraout_XMM0_Dc_08;
  float extraout_XMM0_Dc_09;
  float extraout_XMM0_Dc_10;
  float extraout_XMM0_Dc_11;
  float extraout_XMM0_Dc_12;
  float extraout_XMM0_Dc_13;
  float extraout_XMM0_Dc_14;
  float extraout_XMM0_Dc_15;
  float extraout_XMM0_Dc_16;
  float extraout_XMM0_Dc_17;
  float extraout_XMM0_Dc_18;
  float extraout_XMM0_Dc_19;
  float extraout_XMM0_Dc_20;
  float extraout_XMM0_Dc_21;
  float extraout_XMM0_Dc_22;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float extraout_XMM0_Dd_09;
  float extraout_XMM0_Dd_10;
  float extraout_XMM0_Dd_11;
  float extraout_XMM0_Dd_12;
  float extraout_XMM0_Dd_13;
  float extraout_XMM0_Dd_14;
  float extraout_XMM0_Dd_15;
  float extraout_XMM0_Dd_16;
  float extraout_XMM0_Dd_17;
  float extraout_XMM0_Dd_18;
  float extraout_XMM0_Dd_19;
  float extraout_XMM0_Dd_20;
  float extraout_XMM0_Dd_21;
  float extraout_XMM0_Dd_22;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<std::complex<float>_> local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  SquareMatrix<std::complex<float>_> local_68;
  SquareMatrix<std::complex<float>_> local_58;
  int *local_48 [2];
  long local_38;
  
  local_a8._0_4_ = (float)CONCAT71(in_register_00000031,side);
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[5])(local_48,this);
  iVar6 = *local_48[0] + offset;
  *local_48[0] = iVar6;
  iVar17 = offset + local_48[0][1];
  local_48[0][1] = iVar17;
  if (iVar6 < nbQubits) {
    if (iVar17 < nbQubits) {
      if (iVar6 + 1 != iVar17) {
        __assert_fail("qubits[0] + 1 == qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                      ,0x29,
                      "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                     );
      }
      (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_1b8,this);
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&local_1b8);
      uVar24 = CONCAT44(local_b8._4_4_,(float)local_b8);
      uVar23 = CONCAT44(local_a8._4_4_,(float)local_a8);
      local_b8 = uVar24;
      if ((char)local_a8 == 'L') {
        if (nbQubits == 2) {
          dense::SquareMatrix<std::complex<float>_>::operator*=(matrix,&local_1b8);
          uVar23 = CONCAT44(local_a8._4_4_,(float)local_a8);
          local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
        }
        else {
          uVar3 = local_48[0][1];
          lVar18 = matrix->size_;
          local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
          if (0 < lVar18) {
            lVar12 = (long)(1 << ((byte)(~uVar3 + nbQubits) & 0x1f));
            iVar6 = *local_48[0];
            uVar14 = 1 << ((byte)iVar6 & 0x1f);
            lVar13 = 1;
            if (1 < lVar12) {
              lVar13 = lVar12;
            }
            if ((int)uVar14 < 2) {
              uVar14 = 1;
            }
            uVar15 = (ulong)uVar14;
            lVar10 = lVar12 * 4;
            local_70 = lVar12 * 2;
            local_78 = lVar12 * 3;
            lVar19 = 0;
            local_b8 = uVar24;
            do {
              if (iVar6 != 0x1f) {
                lVar18 = 0;
                uVar7 = 0;
                do {
                  lVar8 = lVar13;
                  local_88 = uVar7;
                  local_80 = lVar18;
                  if (~uVar3 + nbQubits != 0x1f) {
                    do {
                      lVar16 = lVar12 + lVar18;
                      lVar9 = local_70 + lVar18;
                      lVar1 = local_78 + lVar18;
                      lVar4 = matrix->size_;
                      pcVar5 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar37 = *(float *)&pcVar5[lVar4 * lVar18 + lVar19]._M_value;
                      local_a8._0_4_ =
                           *(float *)((long)&pcVar5[lVar4 * lVar18 + lVar19]._M_value + 4);
                      lVar11 = lVar4 * lVar16;
                      fVar38 = *(float *)&pcVar5[lVar11 + lVar19]._M_value;
                      fVar40 = *(float *)((long)&pcVar5[lVar11 + lVar19]._M_value + 4);
                      lVar11 = lVar4 * lVar9;
                      fVar22 = *(float *)&pcVar5[lVar11 + lVar19]._M_value;
                      fVar32 = *(float *)((long)&pcVar5[lVar11 + lVar19]._M_value + 4);
                      fVar50 = (float)pcVar5[lVar4 * lVar1 + lVar19]._M_value;
                      fVar51 = (float)(pcVar5[lVar4 * lVar1 + lVar19]._M_value >> 0x20);
                      fVar34 = (float)*(_ComplexT *)
                                       local_1b8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl;
                      fVar72 = (float)(*(_ComplexT *)
                                        local_1b8.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl >> 0x20);
                      fVar44 = fVar37 * fVar34 - (float)local_a8 * fVar72;
                      fVar46 = fVar37 * 0.0 - (float)local_a8 * 0.0;
                      fVar48 = fVar37 * 0.0 - (float)local_a8 * 0.0;
                      fVar35 = fVar37 * fVar72 + (float)local_a8 * fVar34;
                      uVar52 = 0;
                      uVar53 = 0;
                      uVar54 = 0;
                      uVar55 = 0;
                      uVar56 = 0;
                      uVar57 = 0;
                      uVar58 = 0;
                      uVar59 = 0;
                      uVar60 = 0;
                      uVar61 = 0;
                      uVar62 = 0;
                      uVar63 = 0;
                      uVar64 = 0;
                      uVar65 = 0;
                      uVar66 = 0;
                      fVar39 = (float)local_a8;
                      uVar67 = 0;
                      uVar68 = 0;
                      uVar69 = 0;
                      fVar31 = fVar37;
                      fVar70 = fVar37;
                      fVar30 = fVar37;
                      fVar71 = fVar37;
                      local_a8._4_4_ = (float)local_a8;
                      fStack_a0 = (float)local_a8;
                      fStack_9c = (float)local_a8;
                      local_90 = lVar8;
                      uVar23 = CONCAT44(fVar35,fVar44);
                      if ((NAN(fVar44)) && (uVar23 = CONCAT44(fVar35,fVar44), NAN(fVar35))) {
                        local_178._0_8_ = uVar15;
                        local_1a8 = ZEXT416((uint)fVar22);
                        _local_198 = ZEXT416((uint)fVar32);
                        local_188 = ZEXT416((uint)fVar38);
                        local_168 = ZEXT416((uint)fVar40);
                        local_158 = ZEXT416((uint)fVar37);
                        local_f8 = ZEXT416((uint)(float)local_a8);
                        local_138 = fVar37;
                        fStack_134 = fVar37;
                        fStack_130 = fVar37;
                        fStack_12c = fVar37;
                        local_e8 = lVar12;
                        fStack_9c = fStack_a0;
                        uVar23 = __mulsc3(fVar34,fVar72,fVar37,fStack_a0);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar46 = extraout_XMM0_Dc;
                        fVar48 = extraout_XMM0_Dd;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                      }
                      fVar20 = (float)((complex<float> *)
                                      ((long)local_1b8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + 8))->_M_value;
                      fVar28 = (float)(((complex<float> *)
                                       ((long)local_1b8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + 8))->_M_value >> 0x20);
                      local_c8._0_4_ = fVar38 * fVar20 - fVar40 * fVar28;
                      fStack_c0 = fVar38 * 0.0 - fVar40 * 0.0;
                      fStack_bc = fVar38 * 0.0 - fVar40 * 0.0;
                      local_c8._4_4_ = fVar38 * fVar28 + fVar40 * fVar20;
                      fVar34 = fVar38;
                      fVar72 = fVar38;
                      fVar46 = fVar38;
                      fVar48 = fVar38;
                      fVar35 = fVar40;
                      fVar44 = fVar40;
                      fVar47 = fVar40;
                      fVar49 = fVar40;
                      fStack_d0 = fVar46;
                      fStack_cc = fVar48;
                      local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8);
                      local_d8 = uVar23;
                      if ((NAN((float)local_c8)) &&
                         (local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(local_c8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_148 = fVar40;
                        fStack_144 = fVar40;
                        fStack_140 = fVar40;
                        fStack_13c = fVar40;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_118 = fVar38;
                        fStack_114 = fVar38;
                        fStack_110 = fVar38;
                        fStack_10c = fVar38;
                        local_e8 = lVar12;
                        local_c8 = __mulsc3(fVar20,fVar28,fVar38,fVar40);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_c0 = extraout_XMM0_Dc_00;
                        fStack_bc = extraout_XMM0_Dd_00;
                      }
                      fVar21 = (float)((complex<float> *)
                                      ((long)local_1b8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + 0x10))->_M_value;
                      fVar29 = (float)(((complex<float> *)
                                       ((long)local_1b8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + 0x10))->_M_value >> 0x20);
                      local_b8._0_4_ = fVar22 * fVar21 - fVar32 * fVar29;
                      fStack_b0 = fVar22 * 0.0 - fVar32 * 0.0;
                      fStack_ac = fVar22 * 0.0 - fVar32 * 0.0;
                      local_b8._4_4_ = fVar22 * fVar29 + fVar32 * fVar21;
                      fVar20 = fVar22;
                      fVar28 = fVar22;
                      fVar36 = fVar22;
                      fVar45 = fVar22;
                      fVar73 = fVar32;
                      fVar74 = fVar32;
                      fVar75 = fVar32;
                      fVar76 = fVar32;
                      local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
                      if ((NAN((float)local_b8)) &&
                         (local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8), NAN(local_b8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar22;
                        local_108._0_4_ = fVar22;
                        fStack_100 = fVar22;
                        fStack_fc = fVar22;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar32;
                        fStack_124 = fVar32;
                        fStack_120 = fVar32;
                        fStack_11c = fVar32;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_e8 = lVar12;
                        local_b8 = __mulsc3(fVar21,fVar29,fVar22,fVar32);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_b0 = extraout_XMM0_Dc_01;
                        fStack_ac = extraout_XMM0_Dd_01;
                      }
                      _Var2 = ((complex<float> *)
                              ((long)local_1b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 0x18))->_M_value;
                      fVar41 = (float)_Var2;
                      fVar33 = (float)(_Var2 >> 0x20);
                      fVar21 = fVar50 * fVar41 - fVar51 * fVar33;
                      fVar29 = fVar41 * fVar51 + fVar33 * fVar50;
                      uVar23 = CONCAT44(fVar29,fVar21);
                      uVar24 = local_d8;
                      uVar25 = local_c8;
                      uVar26 = local_b8;
                      if ((NAN(fVar21)) && (uVar23 = CONCAT44(fVar29,fVar21), NAN(fVar29))) {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_e8 = lVar12;
                        uVar23 = __mulsc3(fVar41,fVar33,fVar50,fVar51);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        uVar24 = local_d8;
                        uVar25 = local_c8;
                        uVar26 = local_b8;
                      }
                      local_b8._4_4_ = (float)((ulong)uVar26 >> 0x20);
                      local_b8._0_4_ = (float)uVar26;
                      local_c8._4_4_ = (float)((ulong)uVar25 >> 0x20);
                      local_c8._0_4_ = (float)uVar25;
                      local_d8._4_4_ = (float)((ulong)uVar24 >> 0x20);
                      local_d8._0_4_ = (float)uVar24;
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [matrix->size_ * lVar18 + lVar19]._M_value =
                           CONCAT44(local_d8._4_4_ + local_c8._4_4_ + local_b8._4_4_ +
                                    (float)((ulong)uVar23 >> 0x20),
                                    (float)local_d8 + (float)local_c8 + (float)local_b8 +
                                    (float)uVar23);
                      fVar21 = (float)((complex<float> *)
                                      ((long)local_1b8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + local_1b8.size_ * 8))->_M_value;
                      fVar29 = (float)(((complex<float> *)
                                       ((long)local_1b8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + local_1b8.size_ * 8))->_M_value >> 0x20
                                      );
                      local_d8._0_4_ = fVar31 * fVar21 - local_a8._4_4_ * fVar29;
                      fStack_d0 = fVar30 * 0.0 - fStack_a0 * 0.0;
                      fStack_cc = fVar71 * 0.0 - fStack_9c * 0.0;
                      local_d8._4_4_ = fVar70 * fVar29 + (float)local_a8 * fVar21;
                      local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8);
                      local_b8 = uVar26;
                      if ((NAN((float)local_d8)) &&
                         (local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8), NAN(local_d8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_e8 = lVar12;
                        local_c8 = uVar25;
                        local_d8 = __mulsc3(fVar21,fVar29,fVar37,fVar39);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_d0 = extraout_XMM0_Dc_02;
                        fStack_cc = extraout_XMM0_Dd_02;
                      }
                      fVar21 = (float)((complex<float> *)
                                      ((long)local_1b8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_1b8.size_ + 1) * 8))->_M_value;
                      fVar29 = (float)(((complex<float> *)
                                       ((long)local_1b8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_1b8.size_ + 1) * 8))->_M_value
                                      >> 0x20);
                      local_c8._0_4_ = fVar34 * fVar21 - fVar44 * fVar29;
                      fStack_c0 = fVar46 * 0.0 - fVar47 * 0.0;
                      fStack_bc = fVar48 * 0.0 - fVar49 * 0.0;
                      local_c8._4_4_ = fVar72 * fVar29 + fVar35 * fVar21;
                      local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8);
                      if ((NAN((float)local_c8)) &&
                         (local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(local_c8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_e8 = lVar12;
                        local_c8 = __mulsc3(fVar21,fVar29,fVar38,fVar40);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_c0 = extraout_XMM0_Dc_03;
                        fStack_bc = extraout_XMM0_Dd_03;
                      }
                      _Var2 = ((complex<float> *)
                              ((long)local_1b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 0x10))[local_1b8.size_]._M_value;
                      fVar21 = (float)_Var2;
                      fVar29 = (float)(_Var2 >> 0x20);
                      local_b8._0_4_ = fVar20 * fVar21 - fVar74 * fVar29;
                      fStack_b0 = fVar36 * 0.0 - fVar75 * 0.0;
                      fStack_ac = fVar45 * 0.0 - fVar76 * 0.0;
                      local_b8._4_4_ = fVar28 * fVar29 + fVar73 * fVar21;
                      local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
                      if ((NAN((float)local_b8)) &&
                         (local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8), NAN(local_b8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_e8 = lVar12;
                        local_b8 = __mulsc3(fVar21,fVar29,fVar22,fVar32);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_b0 = extraout_XMM0_Dc_04;
                        fStack_ac = extraout_XMM0_Dd_04;
                      }
                      fVar41 = (float)((complex<float> *)
                                      ((long)local_1b8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_1b8.size_ + 3) * 8))->_M_value;
                      fVar33 = (float)(((complex<float> *)
                                       ((long)local_1b8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_1b8.size_ + 3) * 8))->_M_value
                                      >> 0x20);
                      fVar21 = fVar50 * fVar41 - fVar51 * fVar33;
                      fVar29 = fVar41 * fVar51 + fVar33 * fVar50;
                      uVar23 = CONCAT44(fVar29,fVar21);
                      uVar24 = local_d8;
                      uVar25 = local_c8;
                      uVar26 = local_b8;
                      if ((NAN(fVar21)) && (uVar23 = CONCAT44(fVar29,fVar21), NAN(fVar29))) {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_e8 = lVar12;
                        uVar23 = __mulsc3(fVar41,fVar33,fVar50,fVar51);
                        lVar12 = local_e8;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        uVar24 = local_d8;
                        uVar25 = local_c8;
                        uVar26 = local_b8;
                      }
                      local_b8._4_4_ = (float)((ulong)uVar26 >> 0x20);
                      local_b8._0_4_ = (float)uVar26;
                      local_c8._4_4_ = (float)((ulong)uVar25 >> 0x20);
                      local_c8._0_4_ = (float)uVar25;
                      local_d8._4_4_ = (float)((ulong)uVar24 >> 0x20);
                      local_d8._0_4_ = (float)uVar24;
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar16 * matrix->size_ + lVar19]._M_value =
                           CONCAT44(local_d8._4_4_ + local_c8._4_4_ + local_b8._4_4_ +
                                    (float)((ulong)uVar23 >> 0x20),
                                    (float)local_d8 + (float)local_c8 + (float)local_b8 +
                                    (float)uVar23);
                      lVar8 = local_1b8.size_ * 0x10;
                      fVar21 = (float)((complex<float> *)
                                      ((long)local_1b8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + local_1b8.size_ * 2 * 8))->_M_value;
                      fVar29 = (float)(((complex<float> *)
                                       ((long)local_1b8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + local_1b8.size_ * 2 * 8))->_M_value >>
                                      0x20);
                      local_d8._0_4_ = fVar31 * fVar21 - local_a8._4_4_ * fVar29;
                      fStack_d0 = fVar30 * 0.0 - fStack_a0 * 0.0;
                      fStack_cc = fVar71 * 0.0 - fStack_9c * 0.0;
                      local_d8._4_4_ = fVar70 * fVar29 + (float)local_a8 * fVar21;
                      local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8);
                      local_b8 = uVar26;
                      if ((NAN((float)local_d8)) &&
                         (local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8), NAN(local_d8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_c8 = uVar25;
                        local_d8 = __mulsc3(fVar21,fVar29,fVar37,fVar39);
                        lVar8 = local_1b8.size_ << 4;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_d0 = extraout_XMM0_Dc_05;
                        fStack_cc = extraout_XMM0_Dd_05;
                      }
                      uVar23 = *(undefined8 *)
                                ((long)&((complex<float> *)
                                        ((long)local_1b8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                               .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                               _M_head_impl + 8))->_M_value + lVar8);
                      fVar21 = (float)uVar23;
                      fVar29 = (float)((ulong)uVar23 >> 0x20);
                      local_c8._0_4_ = fVar34 * fVar21 - fVar44 * fVar29;
                      fStack_c0 = fVar46 * 0.0 - fVar47 * 0.0;
                      fStack_bc = fVar48 * 0.0 - fVar49 * 0.0;
                      local_c8._4_4_ = fVar72 * fVar29 + fVar35 * fVar21;
                      local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8);
                      if ((NAN((float)local_c8)) &&
                         (local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(local_c8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_c8 = __mulsc3(fVar21,fVar29,fVar38,fVar40);
                        lVar8 = local_1b8.size_ << 4;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_c0 = extraout_XMM0_Dc_06;
                        fStack_bc = extraout_XMM0_Dd_06;
                      }
                      uVar23 = *(undefined8 *)
                                ((long)&((complex<float> *)
                                        ((long)local_1b8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                               .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                               _M_head_impl + 0x10))->_M_value + lVar8);
                      fVar21 = (float)uVar23;
                      fVar29 = (float)((ulong)uVar23 >> 0x20);
                      local_b8._0_4_ = fVar20 * fVar21 - fVar74 * fVar29;
                      fStack_b0 = fVar36 * 0.0 - fVar75 * 0.0;
                      fStack_ac = fVar45 * 0.0 - fVar76 * 0.0;
                      local_b8._4_4_ = fVar28 * fVar29 + fVar73 * fVar21;
                      local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
                      if ((NAN((float)local_b8)) &&
                         (local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8), NAN(local_b8._4_4_)))
                      {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_b8 = __mulsc3(fVar21,fVar29,fVar22,fVar32);
                        lVar8 = local_1b8.size_ << 4;
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        uVar64 = local_158._4_4_;
                        uVar65 = local_158._8_4_;
                        uVar66 = local_158._12_4_;
                        fVar39 = (float)local_f8._0_4_;
                        uVar67 = local_f8._4_4_;
                        uVar68 = local_f8._8_4_;
                        uVar69 = local_f8._12_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_b0 = extraout_XMM0_Dc_07;
                        fStack_ac = extraout_XMM0_Dd_07;
                      }
                      uVar23 = *(undefined8 *)
                                ((long)&((complex<float> *)
                                        ((long)local_1b8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                               .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                               _M_head_impl + 0x18))->_M_value + lVar8);
                      fVar41 = (float)uVar23;
                      fVar33 = (float)((ulong)uVar23 >> 0x20);
                      fVar21 = fVar50 * fVar41 - fVar51 * fVar33;
                      fVar29 = fVar41 * fVar51 + fVar33 * fVar50;
                      uVar23 = CONCAT44(fVar29,fVar21);
                      uVar24 = local_d8;
                      uVar25 = local_c8;
                      uVar26 = local_b8;
                      if ((NAN(fVar21)) && (uVar23 = CONCAT44(fVar29,fVar21), NAN(fVar29))) {
                        local_178._0_8_ = uVar15;
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_158._4_4_ = uVar64;
                        local_158._0_4_ = fVar37;
                        local_158._8_4_ = uVar65;
                        local_158._12_4_ = uVar66;
                        local_f8._4_4_ = uVar67;
                        local_f8._0_4_ = fVar39;
                        local_f8._8_4_ = uVar68;
                        local_f8._12_4_ = uVar69;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_138 = fVar31;
                        fStack_134 = fVar70;
                        fStack_130 = fVar30;
                        fStack_12c = fVar71;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        uVar23 = __mulsc3(fVar41,fVar33,fVar50,fVar51);
                        uVar15 = local_178._0_8_;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        uVar58 = local_188._4_4_;
                        uVar59 = local_188._8_4_;
                        uVar60 = local_188._12_4_;
                        fVar40 = (float)local_168._0_4_;
                        uVar61 = local_168._4_4_;
                        uVar62 = local_168._8_4_;
                        uVar63 = local_168._12_4_;
                        fVar37 = (float)local_158._0_4_;
                        fVar39 = (float)local_f8._0_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar31 = local_138;
                        fVar70 = fStack_134;
                        fVar30 = fStack_130;
                        fVar71 = fStack_12c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        uVar24 = local_d8;
                        uVar25 = local_c8;
                        uVar26 = local_b8;
                      }
                      local_b8._4_4_ = (float)((ulong)uVar26 >> 0x20);
                      local_b8._0_4_ = (float)uVar26;
                      local_c8._4_4_ = (float)((ulong)uVar25 >> 0x20);
                      local_c8._0_4_ = (float)uVar25;
                      local_d8._4_4_ = (float)((ulong)uVar24 >> 0x20);
                      local_d8._0_4_ = (float)uVar24;
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar9 * matrix->size_ + lVar19]._M_value =
                           CONCAT44(local_d8._4_4_ + local_c8._4_4_ + local_b8._4_4_ +
                                    (float)((ulong)uVar23 >> 0x20),
                                    (float)local_d8 + (float)local_c8 + (float)local_b8 +
                                    (float)uVar23);
                      lVar16 = local_1b8.size_ * 0x18;
                      _Var2 = ((complex<float> *)
                              ((long)local_1b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + lVar16))->_M_value;
                      fVar21 = (float)_Var2;
                      fVar29 = (float)(_Var2 >> 0x20);
                      fVar41 = (float)local_a8 * fVar21;
                      local_a8._0_4_ = fVar31 * fVar21 - local_a8._4_4_ * fVar29;
                      fStack_a0 = fVar30 * 0.0 - fStack_a0 * 0.0;
                      fStack_9c = fVar71 * 0.0 - fStack_9c * 0.0;
                      local_a8._4_4_ = fVar70 * fVar29 + fVar41;
                      local_a8 = CONCAT44(local_a8._4_4_,(float)local_a8);
                      local_d8 = uVar24;
                      local_c8 = uVar25;
                      local_b8 = uVar26;
                      if ((NAN((float)local_a8)) &&
                         (local_a8 = CONCAT44(local_a8._4_4_,(float)local_a8), NAN(local_a8._4_4_)))
                      {
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_188._4_4_ = uVar58;
                        local_188._0_4_ = fVar38;
                        local_188._8_4_ = uVar59;
                        local_188._12_4_ = uVar60;
                        local_168._4_4_ = uVar61;
                        local_168._0_4_ = fVar40;
                        local_168._8_4_ = uVar62;
                        local_168._12_4_ = uVar63;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_148 = fVar35;
                        fStack_144 = fVar44;
                        fStack_140 = fVar47;
                        fStack_13c = fVar49;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        local_118 = fVar34;
                        fStack_114 = fVar72;
                        fStack_110 = fVar46;
                        fStack_10c = fVar48;
                        local_a8 = __mulsc3(fVar21,fVar29,fVar37,fVar39);
                        lVar16 = local_1b8.size_ * 0x18;
                        fVar22 = (float)local_1a8._0_4_;
                        uVar52 = local_1a8._4_4_;
                        uVar53 = local_1a8._8_4_;
                        uVar54 = local_1a8._12_4_;
                        fVar32 = (float)local_198._0_4_;
                        uVar55 = local_198._4_4_;
                        uVar56 = uStack_190;
                        uVar57 = uStack_18c;
                        fVar38 = (float)local_188._0_4_;
                        fVar40 = (float)local_168._0_4_;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar34 = local_118;
                        fVar72 = fStack_114;
                        fVar46 = fStack_110;
                        fVar48 = fStack_10c;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                        fVar35 = local_148;
                        fVar44 = fStack_144;
                        fVar47 = fStack_140;
                        fVar49 = fStack_13c;
                        fStack_a0 = extraout_XMM0_Dc_08;
                        fStack_9c = extraout_XMM0_Dd_08;
                      }
                      uVar23 = *(undefined8 *)
                                ((long)&((complex<float> *)
                                        ((long)local_1b8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                               .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                               _M_head_impl + 8))->_M_value + lVar16);
                      fVar31 = (float)uVar23;
                      fVar70 = (float)((ulong)uVar23 >> 0x20);
                      fVar30 = fVar34 * fVar31 - fVar44 * fVar70;
                      fVar37 = fVar46 * 0.0 - fVar47 * 0.0;
                      fVar39 = fVar48 * 0.0 - fVar49 * 0.0;
                      fVar46 = fVar72 * fVar70 + fVar35 * fVar31;
                      uVar24 = CONCAT44(fVar46,fVar30);
                      if ((NAN(fVar30)) && (uVar24 = CONCAT44(fVar46,fVar30), NAN(fVar46))) {
                        local_1a8._4_4_ = uVar52;
                        local_1a8._0_4_ = fVar22;
                        local_1a8._8_4_ = uVar53;
                        local_1a8._12_4_ = uVar54;
                        local_198._4_4_ = uVar55;
                        local_198._0_4_ = fVar32;
                        uStack_190 = uVar56;
                        uStack_18c = uVar57;
                        local_108._4_4_ = fVar28;
                        local_108._0_4_ = fVar20;
                        fStack_100 = fVar36;
                        fStack_fc = fVar45;
                        local_128 = fVar73;
                        fStack_124 = fVar74;
                        fStack_120 = fVar75;
                        fStack_11c = fVar76;
                        uVar24 = __mulsc3(fVar31,fVar70,fVar38,fVar40);
                        lVar16 = local_1b8.size_ * 0x18;
                        fVar22 = (float)local_1a8._0_4_;
                        fVar32 = (float)local_198._0_4_;
                        fVar37 = extraout_XMM0_Dc_09;
                        fVar39 = extraout_XMM0_Dd_09;
                        fVar20 = (float)local_108._0_4_;
                        fVar28 = (float)local_108._4_4_;
                        fVar36 = fStack_100;
                        fVar45 = fStack_fc;
                        fVar73 = local_128;
                        fVar74 = fStack_124;
                        fVar75 = fStack_120;
                        fVar76 = fStack_11c;
                      }
                      uVar23 = *(undefined8 *)
                                ((long)&((complex<float> *)
                                        ((long)local_1b8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                               .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                               _M_head_impl + 0x10))->_M_value + lVar16);
                      fVar46 = (float)uVar23;
                      fVar48 = (float)((ulong)uVar23 >> 0x20);
                      fVar31 = fVar20 * fVar46 - fVar74 * fVar48;
                      fVar38 = fVar36 * 0.0 - fVar75 * 0.0;
                      fVar40 = fVar45 * 0.0 - fVar76 * 0.0;
                      fVar70 = fVar28 * fVar48 + fVar73 * fVar46;
                      uVar25 = CONCAT44(fVar70,fVar31);
                      if ((NAN(fVar31)) && (uVar25 = CONCAT44(fVar70,fVar31), NAN(fVar70))) {
                        fStack_d0 = fVar37;
                        fStack_cc = fVar39;
                        local_d8 = uVar24;
                        uVar25 = __mulsc3(fVar46,fVar48,fVar22,fVar32);
                        lVar16 = local_1b8.size_ * 0x18;
                        fVar38 = extraout_XMM0_Dc_10;
                        fVar40 = extraout_XMM0_Dd_10;
                        fVar37 = fStack_d0;
                        fVar39 = fStack_cc;
                        uVar24 = local_d8;
                      }
                      lVar8 = local_90;
                      uVar23 = *(undefined8 *)
                                ((long)&((complex<float> *)
                                        ((long)local_1b8.data_._M_t.
                                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                               .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                               _M_head_impl + 0x18))->_M_value + lVar16);
                      fVar46 = (float)uVar23;
                      fVar48 = (float)((ulong)uVar23 >> 0x20);
                      fVar22 = fVar50 * fVar46 - fVar51 * fVar48;
                      fVar32 = fVar46 * fVar51 + fVar48 * fVar50;
                      uVar26 = CONCAT44(fVar32,fVar22);
                      uVar23 = local_a8;
                      if ((NAN(fVar22)) && (uVar26 = CONCAT44(fVar32,fVar22), NAN(fVar32))) {
                        local_178._0_8_ = uVar15;
                        fStack_d0 = fVar37;
                        fStack_cc = fVar39;
                        fStack_c0 = fVar38;
                        fStack_bc = fVar40;
                        local_c8 = uVar25;
                        local_d8 = uVar24;
                        uVar26 = __mulsc3(fVar46,fVar48,fVar50,fVar51);
                        uVar15 = local_178._0_8_;
                        uVar25 = local_c8;
                        uVar24 = local_d8;
                        uVar23 = local_a8;
                      }
                      local_a8._4_4_ = (float)((ulong)uVar23 >> 0x20);
                      local_a8._0_4_ = (float)uVar23;
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar1 * matrix->size_ + lVar19]._M_value =
                           CONCAT44(local_a8._4_4_ + (float)((ulong)uVar24 >> 0x20) +
                                    (float)((ulong)uVar25 >> 0x20) + (float)((ulong)uVar26 >> 0x20),
                                    (float)local_a8 + (float)uVar24 + (float)uVar25 + (float)uVar26)
                      ;
                      lVar18 = lVar18 + 1;
                      lVar8 = lVar8 + -1;
                    } while (lVar8 != 0);
                  }
                  uVar7 = local_88 + 1;
                  lVar18 = local_80 + lVar10;
                } while (uVar7 != uVar15);
                lVar18 = matrix->size_;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < lVar18);
          }
        }
      }
      else if (nbQubits == 2) {
        dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_68,&local_1b8);
        dense::SquareMatrix<std::complex<float>_>::operator*=(&local_68,matrix);
        dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_58,&local_68);
        dense::SquareMatrix<std::complex<float>_>::operator=(matrix,&local_58);
        if ((_Head_base<0UL,_std::complex<float>_*,_false>)
            local_58.data_._M_t.
            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
            _M_t.
            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
            .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
            (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
          operator_delete__((void *)local_58.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                    .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                    _M_head_impl);
        }
        local_58.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
               0x0;
        if (local_68.data_._M_t.
            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
            _M_t.
            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
            .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0)
        {
          operator_delete__((void *)local_68.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                    .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                    _M_head_impl);
        }
        uVar23 = CONCAT44(local_a8._4_4_,(float)local_a8);
        local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
               0x0;
        local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
      }
      else {
        uVar3 = local_48[0][1];
        lVar18 = matrix->size_;
        if (0 < lVar18) {
          lVar13 = (long)(1 << ((byte)(~uVar3 + nbQubits) & 0x1f));
          iVar6 = *local_48[0];
          uVar14 = 1 << ((byte)iVar6 & 0x1f);
          lVar12 = 1;
          if (1 < lVar13) {
            lVar12 = lVar13;
          }
          if ((int)uVar14 < 2) {
            uVar14 = 1;
          }
          lVar19 = lVar13 << 5;
          local_80 = lVar13 * 8;
          local_88 = lVar13 * 0x18;
          lVar8 = 0;
          lVar10 = 0;
          do {
            if (iVar6 != 0x1f) {
              local_90 = 0;
              uVar7 = 0;
              lVar18 = lVar13 << 4;
              lVar16 = local_80;
              uVar15 = local_88;
              local_78 = lVar10;
              do {
                local_70 = uVar7;
                if (~uVar3 + nbQubits != 0x1f) {
                  lVar10 = 0;
                  do {
                    lVar9 = matrix->size_ * lVar8;
                    pcVar5 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                    fVar37 = *(float *)((long)&pcVar5->_M_value + lVar10 + local_90 + lVar9);
                    fVar38 = *(float *)((long)&pcVar5->_M_value + lVar10 + 4 + local_90 + lVar9);
                    fVar40 = *(float *)((long)&pcVar5->_M_value + lVar10 + lVar16 + lVar9);
                    fVar22 = *(float *)((long)&pcVar5->_M_value + lVar10 + 4 + lVar16 + lVar9);
                    fVar32 = *(float *)((long)&pcVar5->_M_value + lVar10 + lVar18 + lVar9);
                    fVar39 = *(float *)((long)&pcVar5->_M_value + lVar10 + 4 + lVar18 + lVar9);
                    uVar7 = *(ulong *)((long)&pcVar5->_M_value + lVar10 + uVar15 + lVar9);
                    fVar48 = (float)(uVar7 >> 0x20);
                    fVar20 = (float)*(_ComplexT *)
                                     local_1b8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl;
                    fVar28 = (float)(*(_ComplexT *)
                                      local_1b8.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                      .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl >> 0x20);
                    fVar45 = fVar37 * fVar20 - fVar38 * fVar28;
                    fVar47 = fVar37 * 0.0 - fVar38 * 0.0;
                    fVar49 = fVar37 * 0.0 - fVar38 * 0.0;
                    fVar36 = fVar37 * fVar28 + fVar38 * fVar20;
                    fVar46 = (float)uVar7;
                    uVar52 = 0;
                    uVar53 = 0;
                    uVar54 = 0;
                    uVar55 = 0;
                    uVar56 = 0;
                    uVar57 = 0;
                    uVar58 = 0;
                    uVar59 = 0;
                    uVar60 = 0;
                    uVar61 = 0;
                    uVar62 = 0;
                    uVar63 = 0;
                    uVar64 = 0;
                    uVar65 = 0;
                    uVar66 = 0;
                    uVar67 = 0;
                    uVar68 = 0;
                    uVar69 = 0;
                    fVar31 = (float)0;
                    fVar70 = (float)0;
                    fVar30 = fVar37;
                    fVar71 = fVar37;
                    fVar34 = fVar37;
                    fVar72 = fVar37;
                    fVar35 = fVar38;
                    fVar44 = fVar38;
                    fVar50 = fVar38;
                    fVar51 = fVar38;
                    uVar24 = CONCAT44(fVar36,fVar45);
                    if ((NAN(fVar45)) && (uVar24 = CONCAT44(fVar36,fVar45), NAN(fVar36))) {
                      local_1a8._0_8_ = lVar19;
                      _uStack_190 = 0;
                      local_198 = (undefined1  [8])uVar7;
                      local_178 = ZEXT416((uint)fVar32);
                      local_188 = ZEXT416((uint)fVar39);
                      local_168 = ZEXT416((uint)fVar40);
                      local_158 = ZEXT416((uint)fVar22);
                      local_f8 = ZEXT416((uint)fVar37);
                      _local_108 = ZEXT416((uint)fVar38);
                      local_138 = fVar38;
                      fStack_134 = fVar38;
                      fStack_130 = fVar38;
                      fStack_12c = fVar38;
                      local_118 = fVar37;
                      fStack_114 = fVar37;
                      fStack_110 = fVar37;
                      fStack_10c = fVar37;
                      local_a8 = uVar23;
                      uVar24 = __mulsc3(fVar20,fVar28,fVar37,fVar38);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = extraout_XMM0_Dc_11;
                      fVar49 = extraout_XMM0_Dd_11;
                      uVar23 = local_a8;
                    }
                    fVar21 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + local_1b8.size_ * 8))->_M_value;
                    fVar29 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + local_1b8.size_ * 8))->_M_value >> 0x20);
                    local_c8._0_4_ = fVar40 * fVar21 - fVar22 * fVar29;
                    fStack_c0 = fVar40 * 0.0 - fVar22 * 0.0;
                    fStack_bc = fVar40 * 0.0 - fVar22 * 0.0;
                    local_c8._4_4_ = fVar40 * fVar29 + fVar22 * fVar21;
                    local_a8._0_4_ = fVar39;
                    fVar20 = fVar40;
                    fVar28 = fVar40;
                    fVar36 = fVar40;
                    fVar45 = fVar40;
                    fVar73 = fVar22;
                    fVar74 = fVar22;
                    fVar75 = fVar22;
                    fVar76 = fVar22;
                    fStack_d0 = fVar47;
                    fStack_cc = fVar49;
                    local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8);
                    local_d8 = uVar24;
                    if ((NAN((float)local_c8)) &&
                       (local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(local_c8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar22,fVar22);
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar40;
                      fStack_124 = fVar40;
                      fStack_120 = fVar40;
                      fStack_11c = fVar40;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar22;
                      fStack_dc = fVar22;
                      local_a8 = uVar23;
                      local_c8 = __mulsc3(fVar21,fVar29,fVar40,fVar22);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      local_a8._0_4_ = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_c0 = extraout_XMM0_Dc_12;
                      fStack_bc = extraout_XMM0_Dd_12;
                    }
                    fVar41 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + local_1b8.size_ * 2 * 8))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + local_1b8.size_ * 2 * 8))->_M_value >>
                                    0x20);
                    local_b8._0_4_ = fVar32 * fVar41 - (float)local_a8 * fVar33;
                    fStack_b0 = fVar32 * 0.0 - (float)local_a8 * 0.0;
                    fStack_ac = fVar32 * 0.0 - (float)local_a8 * 0.0;
                    local_b8._4_4_ = fVar32 * fVar33 + (float)local_a8 * fVar41;
                    fVar39 = (float)local_a8;
                    fVar47 = fVar32;
                    fVar49 = fVar32;
                    fVar21 = fVar32;
                    fVar29 = fVar32;
                    local_a8._4_4_ = (float)local_a8;
                    fStack_a0 = (float)local_a8;
                    fStack_9c = (float)local_a8;
                    local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
                    if ((NAN((float)local_b8)) &&
                       (local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8), NAN(local_b8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = (float)local_a8;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar32;
                      fStack_144 = fVar32;
                      fStack_140 = fVar32;
                      fStack_13c = fVar32;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      fStack_9c = fStack_a0;
                      local_b8 = __mulsc3(fVar41,fVar33,fVar32,fStack_a0);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_b0 = extraout_XMM0_Dc_13;
                      fStack_ac = extraout_XMM0_Dd_13;
                    }
                    _Var2 = ((complex<float> *)
                            ((long)local_1b8.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + local_1b8.size_ * 0x18))->_M_value;
                    fVar42 = (float)_Var2;
                    fVar43 = (float)(_Var2 >> 0x20);
                    fVar41 = fVar46 * fVar42 - fVar48 * fVar43;
                    fVar33 = fVar42 * fVar48 + fVar43 * fVar46;
                    uVar23 = CONCAT44(fVar33,fVar41);
                    uVar24 = local_d8;
                    uVar25 = local_c8;
                    uVar26 = local_b8;
                    if ((NAN(fVar41)) && (uVar23 = CONCAT44(fVar33,fVar41), NAN(fVar33))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      uVar23 = __mulsc3(fVar42,fVar43,fVar46,fVar48);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      uVar24 = local_d8;
                      uVar25 = local_c8;
                      uVar26 = local_b8;
                    }
                    local_b8._4_4_ = (float)((ulong)uVar26 >> 0x20);
                    local_b8._0_4_ = (float)uVar26;
                    local_c8._4_4_ = (float)((ulong)uVar25 >> 0x20);
                    local_c8._0_4_ = (float)uVar25;
                    local_d8._4_4_ = (float)((ulong)uVar24 >> 0x20);
                    local_d8._0_4_ = (float)uVar24;
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar10 + local_90 + matrix->size_ * lVar8) =
                         CONCAT44(local_d8._4_4_ + local_c8._4_4_ + local_b8._4_4_ +
                                  (float)((ulong)uVar23 >> 0x20),
                                  (float)local_d8 + (float)local_c8 + (float)local_b8 +
                                  (float)uVar23);
                    fVar41 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + 8))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8))->_M_value >> 0x20);
                    local_d8._0_4_ = fVar30 * fVar41 - fVar44 * fVar33;
                    fStack_d0 = fVar34 * 0.0 - fVar50 * 0.0;
                    fStack_cc = fVar72 * 0.0 - fVar51 * 0.0;
                    local_d8._4_4_ = fVar71 * fVar33 + fVar35 * fVar41;
                    local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8);
                    local_b8 = uVar26;
                    if ((NAN((float)local_d8)) &&
                       (local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8), NAN(local_d8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      local_c8 = uVar25;
                      local_d8 = __mulsc3(fVar41,fVar33,fVar37,fVar38);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_d0 = extraout_XMM0_Dc_14;
                      fStack_cc = extraout_XMM0_Dd_14;
                    }
                    fVar41 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ + 1) * 8))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ + 1) * 8))->_M_value >>
                                    0x20);
                    local_c8._0_4_ = fVar20 * fVar41 - fVar74 * fVar33;
                    fStack_c0 = fVar36 * 0.0 - fVar75 * 0.0;
                    fStack_bc = fVar45 * 0.0 - fVar76 * 0.0;
                    local_c8._4_4_ = fVar28 * fVar33 + fVar73 * fVar41;
                    local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8);
                    if ((NAN((float)local_c8)) &&
                       (local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(local_c8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      local_c8 = __mulsc3(fVar41,fVar33,fVar40,fVar22);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_c0 = extraout_XMM0_Dc_15;
                      fStack_bc = extraout_XMM0_Dd_15;
                    }
                    _Var2 = ((complex<float> *)
                            ((long)local_1b8.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + 8))[local_1b8.size_ * 2]._M_value;
                    fVar41 = (float)_Var2;
                    fVar33 = (float)(_Var2 >> 0x20);
                    local_b8._0_4_ = fVar47 * fVar41 - local_a8._4_4_ * fVar33;
                    fStack_b0 = fVar21 * 0.0 - fStack_a0 * 0.0;
                    fStack_ac = fVar29 * 0.0 - fStack_9c * 0.0;
                    local_b8._4_4_ = fVar49 * fVar33 + (float)local_a8 * fVar41;
                    local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
                    if ((NAN((float)local_b8)) &&
                       (local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8), NAN(local_b8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      local_b8 = __mulsc3(fVar41,fVar33,fVar32,fVar39);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_b0 = extraout_XMM0_Dc_16;
                      fStack_ac = extraout_XMM0_Dd_16;
                    }
                    fVar42 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ * 3 + 1) * 8))->_M_value;
                    fVar43 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ * 3 + 1) * 8))->_M_value
                                    >> 0x20);
                    fVar41 = fVar46 * fVar42 - fVar48 * fVar43;
                    fVar33 = fVar42 * fVar48 + fVar43 * fVar46;
                    uVar23 = CONCAT44(fVar33,fVar41);
                    uVar24 = local_d8;
                    uVar25 = local_c8;
                    uVar26 = local_b8;
                    if ((NAN(fVar41)) && (uVar23 = CONCAT44(fVar33,fVar41), NAN(fVar33))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      uVar23 = __mulsc3(fVar42,fVar43,fVar46,fVar48);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      uVar24 = local_d8;
                      uVar25 = local_c8;
                      uVar26 = local_b8;
                    }
                    local_b8._4_4_ = (float)((ulong)uVar26 >> 0x20);
                    local_b8._0_4_ = (float)uVar26;
                    local_c8._4_4_ = (float)((ulong)uVar25 >> 0x20);
                    local_c8._0_4_ = (float)uVar25;
                    local_d8._4_4_ = (float)((ulong)uVar24 >> 0x20);
                    local_d8._0_4_ = (float)uVar24;
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar10 + lVar16 + matrix->size_ * lVar8) =
                         CONCAT44(local_d8._4_4_ + local_c8._4_4_ + local_b8._4_4_ +
                                  (float)((ulong)uVar23 >> 0x20),
                                  (float)local_d8 + (float)local_c8 + (float)local_b8 +
                                  (float)uVar23);
                    fVar41 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + 0x10))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 0x10))->_M_value >> 0x20);
                    local_d8._0_4_ = fVar30 * fVar41 - fVar44 * fVar33;
                    fStack_d0 = fVar34 * 0.0 - fVar50 * 0.0;
                    fStack_cc = fVar72 * 0.0 - fVar51 * 0.0;
                    local_d8._4_4_ = fVar71 * fVar33 + fVar35 * fVar41;
                    local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8);
                    local_b8 = uVar26;
                    if ((NAN((float)local_d8)) &&
                       (local_d8 = CONCAT44(local_d8._4_4_,(float)local_d8), NAN(local_d8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      local_c8 = uVar25;
                      local_d8 = __mulsc3(fVar41,fVar33,fVar37,fVar38);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_d0 = extraout_XMM0_Dc_17;
                      fStack_cc = extraout_XMM0_Dd_17;
                    }
                    _Var2 = ((complex<float> *)
                            ((long)local_1b8.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + 0x10))[local_1b8.size_]._M_value;
                    fVar41 = (float)_Var2;
                    fVar33 = (float)(_Var2 >> 0x20);
                    local_c8._0_4_ = fVar20 * fVar41 - fVar74 * fVar33;
                    fStack_c0 = fVar36 * 0.0 - fVar75 * 0.0;
                    fStack_bc = fVar45 * 0.0 - fVar76 * 0.0;
                    local_c8._4_4_ = fVar28 * fVar33 + fVar73 * fVar41;
                    local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8);
                    if ((NAN((float)local_c8)) &&
                       (local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(local_c8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      local_c8 = __mulsc3(fVar41,fVar33,fVar40,fVar22);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_c0 = extraout_XMM0_Dc_18;
                      fStack_bc = extraout_XMM0_Dd_18;
                    }
                    fVar41 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ * 2 + 2) * 8))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ * 2 + 2) * 8))->_M_value
                                    >> 0x20);
                    local_b8._0_4_ = fVar47 * fVar41 - local_a8._4_4_ * fVar33;
                    fStack_b0 = fVar21 * 0.0 - fStack_a0 * 0.0;
                    fStack_ac = fVar29 * 0.0 - fStack_9c * 0.0;
                    local_b8._4_4_ = fVar49 * fVar33 + (float)local_a8 * fVar41;
                    local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8);
                    if ((NAN((float)local_b8)) &&
                       (local_b8 = CONCAT44(local_b8._4_4_,(float)local_b8), NAN(local_b8._4_4_))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      local_b8 = __mulsc3(fVar41,fVar33,fVar32,fVar39);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      uVar66 = local_f8._4_4_;
                      uVar67 = local_f8._8_4_;
                      uVar68 = local_f8._12_4_;
                      fVar38 = (float)local_108._0_4_;
                      uVar69 = local_108._4_4_;
                      fVar31 = fStack_100;
                      fVar70 = fStack_fc;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      fStack_b0 = extraout_XMM0_Dc_19;
                      fStack_ac = extraout_XMM0_Dd_19;
                    }
                    fVar42 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ * 3 + 2) * 8))->_M_value;
                    fVar43 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ * 3 + 2) * 8))->_M_value
                                    >> 0x20);
                    fVar41 = fVar46 * fVar42 - fVar48 * fVar43;
                    fVar33 = fVar42 * fVar48 + fVar43 * fVar46;
                    uVar23 = CONCAT44(fVar33,fVar41);
                    uVar24 = local_d8;
                    uVar25 = local_c8;
                    uVar26 = local_b8;
                    if ((NAN(fVar41)) && (uVar23 = CONCAT44(fVar33,fVar41), NAN(fVar33))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_f8._4_4_ = uVar66;
                      local_f8._0_4_ = fVar37;
                      local_f8._8_4_ = uVar67;
                      local_f8._12_4_ = uVar68;
                      local_108._4_4_ = uVar69;
                      local_108._0_4_ = fVar38;
                      fStack_100 = fVar31;
                      fStack_fc = fVar70;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_138 = fVar35;
                      fStack_134 = fVar44;
                      fStack_130 = fVar50;
                      fStack_12c = fVar51;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      local_118 = fVar30;
                      fStack_114 = fVar71;
                      fStack_110 = fVar34;
                      fStack_10c = fVar72;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      uVar23 = __mulsc3(fVar42,fVar43,fVar46,fVar48);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      uVar60 = local_168._4_4_;
                      uVar61 = local_168._8_4_;
                      uVar62 = local_168._12_4_;
                      fVar22 = (float)local_158._0_4_;
                      uVar63 = local_158._4_4_;
                      uVar64 = local_158._8_4_;
                      uVar65 = local_158._12_4_;
                      fVar37 = (float)local_f8._0_4_;
                      fVar38 = (float)local_108._0_4_;
                      fVar30 = local_118;
                      fVar71 = fStack_114;
                      fVar34 = fStack_110;
                      fVar72 = fStack_10c;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar35 = local_138;
                      fVar44 = fStack_134;
                      fVar50 = fStack_130;
                      fVar51 = fStack_12c;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                      uVar24 = local_d8;
                      uVar25 = local_c8;
                      uVar26 = local_b8;
                    }
                    local_b8._4_4_ = (float)((ulong)uVar26 >> 0x20);
                    local_b8._0_4_ = (float)uVar26;
                    local_c8._4_4_ = (float)((ulong)uVar25 >> 0x20);
                    local_c8._0_4_ = (float)uVar25;
                    local_d8._4_4_ = (float)((ulong)uVar24 >> 0x20);
                    local_d8._0_4_ = (float)uVar24;
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar10 + lVar18 + matrix->size_ * lVar8) =
                         CONCAT44(local_d8._4_4_ + local_c8._4_4_ + local_b8._4_4_ +
                                  (float)((ulong)uVar23 >> 0x20),
                                  (float)local_d8 + (float)local_c8 + (float)local_b8 +
                                  (float)uVar23);
                    _Var2 = ((complex<float> *)
                            ((long)local_1b8.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + 0x18))->_M_value;
                    fVar41 = (float)_Var2;
                    fVar33 = (float)(_Var2 >> 0x20);
                    fVar30 = fVar30 * fVar41 - fVar44 * fVar33;
                    fVar31 = fVar34 * 0.0 - fVar50 * 0.0;
                    fVar70 = fVar72 * 0.0 - fVar51 * 0.0;
                    fVar71 = fVar71 * fVar33 + fVar35 * fVar41;
                    uVar27 = CONCAT44(fVar71,fVar30);
                    local_d8 = uVar24;
                    local_c8 = uVar25;
                    local_b8 = uVar26;
                    if ((NAN(fVar30)) && (uVar27 = CONCAT44(fVar71,fVar30), NAN(fVar71))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_168._4_4_ = uVar60;
                      local_168._0_4_ = fVar40;
                      local_168._8_4_ = uVar61;
                      local_168._12_4_ = uVar62;
                      local_158._4_4_ = uVar63;
                      local_158._0_4_ = fVar22;
                      local_158._8_4_ = uVar64;
                      local_158._12_4_ = uVar65;
                      local_e8 = CONCAT44(fVar74,fVar73);
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      local_128 = fVar20;
                      fStack_124 = fVar28;
                      fStack_120 = fVar36;
                      fStack_11c = fVar45;
                      fStack_e0 = fVar75;
                      fStack_dc = fVar76;
                      uVar27 = __mulsc3(fVar41,fVar33,fVar37,fVar38);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      uVar54 = local_178._4_4_;
                      uVar55 = local_178._8_4_;
                      uVar56 = local_178._12_4_;
                      fVar39 = (float)local_188._0_4_;
                      uVar57 = local_188._4_4_;
                      uVar58 = local_188._8_4_;
                      uVar59 = local_188._12_4_;
                      fVar40 = (float)local_168._0_4_;
                      fVar22 = (float)local_158._0_4_;
                      fVar20 = local_128;
                      fVar28 = fStack_124;
                      fVar36 = fStack_120;
                      fVar45 = fStack_11c;
                      fVar31 = extraout_XMM0_Dc_20;
                      fVar70 = extraout_XMM0_Dd_20;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      fVar73 = (float)local_e8;
                      fVar74 = local_e8._4_4_;
                      fVar75 = fStack_e0;
                      fVar76 = fStack_dc;
                    }
                    fVar30 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ + 3) * 8))->_M_value;
                    fVar71 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ + 3) * 8))->_M_value >>
                                    0x20);
                    fVar34 = fVar20 * fVar30 - fVar74 * fVar71;
                    fVar37 = fVar36 * 0.0 - fVar75 * 0.0;
                    fVar38 = fVar45 * 0.0 - fVar76 * 0.0;
                    fVar72 = fVar28 * fVar71 + fVar73 * fVar30;
                    uVar24 = CONCAT44(fVar72,fVar34);
                    if ((NAN(fVar34)) && (uVar24 = CONCAT44(fVar72,fVar34), NAN(fVar72))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      local_178._4_4_ = uVar54;
                      local_178._0_4_ = fVar32;
                      local_178._8_4_ = uVar55;
                      local_178._12_4_ = uVar56;
                      local_188._4_4_ = uVar57;
                      local_188._0_4_ = fVar39;
                      local_188._8_4_ = uVar58;
                      local_188._12_4_ = uVar59;
                      local_148 = fVar47;
                      fStack_144 = fVar49;
                      fStack_140 = fVar21;
                      fStack_13c = fVar29;
                      fStack_d0 = fVar31;
                      fStack_cc = fVar70;
                      local_d8 = uVar27;
                      uVar24 = __mulsc3(fVar30,fVar71,fVar40,fVar22);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      uVar52 = uStack_190;
                      uVar53 = uStack_18c;
                      fVar32 = (float)local_178._0_4_;
                      fVar39 = (float)local_188._0_4_;
                      fVar37 = extraout_XMM0_Dc_21;
                      fVar38 = extraout_XMM0_Dd_21;
                      fVar31 = fStack_d0;
                      fVar70 = fStack_cc;
                      fVar47 = local_148;
                      fVar49 = fStack_144;
                      fVar21 = fStack_140;
                      fVar29 = fStack_13c;
                      uVar27 = local_d8;
                    }
                    uVar26 = CONCAT44(local_a8._4_4_,(float)local_a8);
                    uVar23 = CONCAT44(local_a8._4_4_,(float)local_a8);
                    fVar30 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ * 2 + 3) * 8))->_M_value;
                    fVar71 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ * 2 + 3) * 8))->_M_value
                                    >> 0x20);
                    fVar34 = fVar47 * fVar30 - local_a8._4_4_ * fVar71;
                    fVar40 = fVar21 * 0.0 - fStack_a0 * 0.0;
                    fVar22 = fVar29 * 0.0 - fStack_9c * 0.0;
                    fVar72 = fVar49 * fVar71 + (float)local_a8 * fVar30;
                    uVar25 = CONCAT44(fVar72,fVar34);
                    local_a8 = uVar24;
                    if ((NAN(fVar34)) &&
                       (uVar25 = CONCAT44(fVar72,fVar34), uVar23 = uVar26, NAN(fVar72))) {
                      local_1a8._0_8_ = lVar19;
                      local_198._4_4_ = fVar48;
                      local_198._0_4_ = fVar46;
                      uStack_190 = uVar52;
                      uStack_18c = uVar53;
                      fStack_d0 = fVar31;
                      fStack_cc = fVar70;
                      fStack_a0 = fVar37;
                      fStack_9c = fVar38;
                      local_d8 = uVar27;
                      uVar25 = __mulsc3(fVar30,fVar71,fVar32,fVar39);
                      lVar19 = local_1a8._0_8_;
                      fVar46 = (float)local_198._0_4_;
                      fVar48 = (float)local_198._4_4_;
                      fVar40 = extraout_XMM0_Dc_22;
                      fVar22 = extraout_XMM0_Dd_22;
                      fVar37 = fStack_a0;
                      fVar38 = fStack_9c;
                      fVar31 = fStack_d0;
                      fVar70 = fStack_cc;
                      uVar27 = local_d8;
                      uVar23 = local_a8;
                    }
                    fVar30 = (float)((complex<float> *)
                                    ((long)local_1b8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_1b8.size_ * 3 + 3) * 8))->_M_value;
                    fVar71 = (float)(((complex<float> *)
                                     ((long)local_1b8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_1b8.size_ * 3 + 3) * 8))->_M_value
                                    >> 0x20);
                    fVar32 = fVar46 * fVar30 - fVar48 * fVar71;
                    fVar39 = fVar30 * fVar48 + fVar71 * fVar46;
                    uVar24 = CONCAT44(fVar39,fVar32);
                    if ((NAN(fVar32)) && (uVar24 = CONCAT44(fVar39,fVar32), NAN(fVar39))) {
                      local_1a8._0_8_ = lVar19;
                      fStack_d0 = fVar31;
                      fStack_cc = fVar70;
                      fStack_c0 = fVar40;
                      fStack_bc = fVar22;
                      fStack_a0 = fVar37;
                      fStack_9c = fVar38;
                      local_c8 = uVar25;
                      local_d8 = uVar27;
                      uVar24 = __mulsc3(fVar30,fVar71,fVar46,fVar48);
                      lVar19 = local_1a8._0_8_;
                      uVar25 = local_c8;
                      uVar27 = local_d8;
                      uVar23 = local_a8;
                    }
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar10 + uVar15 + matrix->size_ * lVar8) =
                         CONCAT44((float)((ulong)uVar27 >> 0x20) + (float)((ulong)local_a8 >> 0x20)
                                  + (float)((ulong)uVar25 >> 0x20) + (float)((ulong)uVar24 >> 0x20),
                                  (float)uVar27 + (float)local_a8 + (float)uVar25 + (float)uVar24);
                    lVar10 = lVar10 + 8;
                  } while (lVar12 << 3 != lVar10);
                }
                uVar7 = local_70 + 1;
                local_90 = local_90 + lVar19;
                uVar15 = uVar15 + lVar19;
                lVar16 = lVar16 + lVar19;
                lVar18 = lVar18 + lVar19;
              } while (uVar7 != uVar14);
              lVar18 = matrix->size_;
              lVar10 = local_78;
            }
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 8;
          } while (lVar10 < lVar18);
        }
      }
      local_a8 = uVar23;
      if (local_1b8.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
        operator_delete__((void *)local_1b8.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,0x28,
                "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }